

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O2

int lj_record_next(jit_State *J,RecordIndex *ix)

{
  long lVar1;
  long lVar2;
  TRef ref;
  TRef TVar3;
  TRef TVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  int iVar8;
  ulong uVar9;
  IRType IVar10;
  ulong uVar11;
  IRType IVar12;
  
  uVar5 = (ix->tabv).u64 & 0x7fffffffffff;
  uVar11 = (ulong)(ix->keyv).u32.lo;
  uVar9 = (ulong)*(uint *)(uVar5 + 0x30);
  uVar7 = uVar9;
  if (uVar9 < uVar11) {
    uVar7 = uVar11;
  }
  do {
    if (uVar9 <= uVar11) {
      uVar6 = (int)uVar7 - *(uint *)(uVar5 + 0x30);
      goto LAB_00149c13;
    }
    lVar1 = *(long *)(*(long *)(uVar5 + 0x10) + uVar11 * 8);
    uVar11 = uVar11 + 1;
  } while (lVar1 == -1);
  IVar10 = 0xe0e;
  if (0xfffffffffffffff1 < (ulong)(lVar1 >> 0x2f)) {
    IVar10 = ~(uint)(lVar1 >> 0x2f) << 8 | IRT_NUM;
  }
  goto LAB_00149b3a;
  while( true ) {
    uVar7 = (ulong)uVar6;
    lVar1 = *(long *)(*(long *)(uVar5 + 0x28) + uVar7 * 0x18);
    uVar6 = uVar6 + 1;
    if (lVar1 != -1) break;
LAB_00149c13:
    if (*(uint *)(uVar5 + 0x34) < uVar6) {
      IVar10 = IRT_NIL;
      goto LAB_00149b3a;
    }
  }
  lVar2 = *(long *)(*(long *)(uVar5 + 0x28) + uVar7 * 0x18 + 8);
  IVar12 = IRT_NUM;
  if (0xfffffffffffffff1 < (ulong)(lVar2 >> 0x2f)) {
    IVar12 = ~(uint)(lVar2 >> 0x2f);
  }
  IVar10 = 0xe00;
  if (0xfffffffffffffff1 < (ulong)(lVar1 >> 0x2f)) {
    IVar10 = ~(uint)(lVar1 >> 0x2f) << 8;
  }
  IVar10 = IVar10 | IVar12;
LAB_00149b3a:
  IVar12 = IVar10 & IRT_T;
  ref = lj_ir_call(J,IRCALL_lj_vm_next,(ulong)ix->tab,(ulong)ix->key);
  if ((ix->mobj != 0) || (IVar12 == IRT_NIL)) {
    (J->fold).ins.field_0.ot = 0x1013;
    (J->fold).ins.field_0.op1 = (IRRef1)ref;
    (J->fold).ins.field_0.op2 = (IRRef1)ref;
    TVar3 = lj_opt_fold(J);
    if (ix->mobj == 0) {
      TVar4 = lj_ir_kint(J,-1);
      (J->fold).ins.field_0.ot = 0x993;
      (J->fold).ins.field_0.op1 = (IRRef1)TVar3;
      (J->fold).ins.field_0.op2 = (IRRef1)TVar4;
      lj_opt_fold(J);
    }
    ix->mobj = TVar3;
  }
  iVar8 = 1;
  TVar3 = lj_record_vload(J,ref,1,IVar12);
  ix->key = TVar3;
  TVar3 = 0x7fff;
  if ((IVar12 != IRT_NIL) && (ix->idxchain == 0)) {
    TVar3 = lj_record_vload(J,ref,0,IVar10 >> 8);
    iVar8 = 2;
  }
  ix->val = TVar3;
  return iVar8;
}

Assistant:

int lj_record_next(jit_State *J, RecordIndex *ix)
{
  IRType t, tkey, tval;
  TRef trvk;
  t = rec_next_types(tabV(&ix->tabv), ix->keyv.u32.lo);
  tkey = (t & 0xff); tval = (t >> 8);
  trvk = lj_ir_call(J, IRCALL_lj_vm_next, ix->tab, ix->key);
  if (ix->mobj || tkey == IRT_NIL) {
    TRef idx = emitir(IRTI(IR_HIOP), trvk, trvk);
    /* Always check for invalid key from next() for nil result. */
    if (!ix->mobj) emitir(IRTGI(IR_NE), idx, lj_ir_kint(J, -1));
    ix->mobj = idx;
  }
  ix->key = lj_record_vload(J, trvk, 1, tkey);
  if (tkey == IRT_NIL || ix->idxchain) {  /* Omit value type check. */
    ix->val = TREF_NIL;
    return 1;
  } else {  /* Need value. */
    ix->val = lj_record_vload(J, trvk, 0, tval);
    return 2;
  }
}